

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::tryCastToType(Value *__return_storage_ptr__,Value *this,Type *destType)

{
  bool bVar1;
  Type local_70;
  Type local_58;
  PackedData local_40;
  
  bVar1 = Type::isIdentical(destType,&this->type);
  if (bVar1) {
    Value(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  bVar1 = TypeRules::canCastTo(destType,&this->type);
  if (bVar1) {
    if ((destType->category == array) && (destType->boundingSize == 0)) {
      Type::removeConstIfPresent(&local_70,destType);
      bVar1 = Type::isIdentical(&local_70,&this->type);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_70.structure);
      if (!bVar1) goto LAB_0020604f;
    }
    Type::Type(&local_58,destType);
    Value(__return_storage_ptr__,&local_58);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_58.structure);
    getData((PackedData *)&local_70,__return_storage_ptr__);
    getData(&local_40,this);
    PackedData::setFrom((PackedData *)&local_70,&local_40);
  }
  else {
LAB_0020604f:
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::tryCastToType (const Type& destType) const
{
    if (destType.isIdentical (type))
        return *this;

    if (! TypeRules::canCastTo (destType, type))
        return {};

    if (destType.isUnsizedArray()
          && ! destType.removeConstIfPresent().isIdentical (type))
        return {};

    Value v (destType);
    v.getData().setFrom (getData());
    return v;
}